

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.h
# Opt level: O1

Float __thiscall
pbrt::FloatCheckerboardTexture::Evaluate(FloatCheckerboardTexture *this,TextureEvalContext ctx)

{
  undefined1 auVar1 [16];
  Float FVar2;
  float fVar3;
  undefined1 auVar4 [64];
  DispatchSplit<12> local_a9;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  local_a8;
  Float local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  TaggedPointer<pbrt::TransformMapping3D> local_78;
  TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
  local_70;
  Tuple3<pbrt::Point3,_float> local_68 [2];
  Tuple3<pbrt::Vector3,_float> aTStack_50 [3];
  int iStack_2c;
  undefined1 extraout_var [56];
  
  local_70.bits =
       (this->map2D).
       super_TaggedPointer<pbrt::UVMapping2D,_pbrt::SphericalMapping2D,_pbrt::CylindricalMapping2D,_pbrt::PlanarMapping2D>
       .bits;
  local_78.bits = (this->map3D).super_TaggedPointer<pbrt::TransformMapping3D>.bits;
  auVar4._0_8_ = Checkerboard(this->aaMethod,ctx,(TextureMapping2DHandle *)&local_70,
                              (TextureMapping3DHandle *)&local_78);
  auVar4._8_56_ = extraout_var;
  local_88 = auVar4._0_16_;
  local_98 = vmovshdup_avx(local_88);
  if ((auVar4._0_4_ != 0.0) || (NAN(auVar4._0_4_))) {
    if ((local_98._0_4_ != 0.0) || (NAN(local_98._0_4_))) {
      local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
      local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
      local_68[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
      local_68[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
      local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
      local_68[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
      aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
      aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
      aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
      aTStack_50[1].z = ctx.dudx;
      aTStack_50[2].x = ctx.dudy;
      aTStack_50[2].y = ctx.dvdx;
      aTStack_50[2].z = ctx.dvdy;
      iStack_2c = ctx.faceIndex;
      local_a8.bits =
           this->tex[0].
           super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
           .bits;
      local_9c = detail::DispatchSplit<12>::operator()
                           (&local_a9,local_68,&local_a8,local_a8.bits >> 0x30);
      local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
      local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
      local_68[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
      local_68[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
      local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
      local_68[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
      aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
      aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
      aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
      aTStack_50[1].z = ctx.dudx;
      aTStack_50[2].x = ctx.dudy;
      aTStack_50[2].y = ctx.dvdx;
      aTStack_50[2].z = ctx.dvdy;
      iStack_2c = ctx.faceIndex;
      local_a8.bits =
           this->tex[1].
           super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
           .bits;
      FVar2 = detail::DispatchSplit<12>::operator()
                        (&local_a9,local_68,&local_a8,local_a8.bits >> 0x30);
      auVar1 = vfmadd231ss_fma(ZEXT416((uint)(FVar2 * (float)local_98._0_4_)),
                               ZEXT416((uint)local_9c),ZEXT416((uint)local_88._0_4_));
      fVar3 = auVar1._0_4_;
    }
    else {
      local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
      local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
      local_68[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
      local_68[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
      local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
      local_68[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
      aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
      aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
      aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
      aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
      aTStack_50[1].z = ctx.dudx;
      aTStack_50[2].x = ctx.dudy;
      aTStack_50[2].y = ctx.dvdx;
      aTStack_50[2].z = ctx.dvdy;
      iStack_2c = ctx.faceIndex;
      local_a8.bits =
           this->tex[0].
           super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
           .bits;
      FVar2 = detail::DispatchSplit<12>::operator()
                        (&local_a9,local_68,&local_a8,local_a8.bits >> 0x30);
      fVar3 = FVar2 * (float)local_88._0_4_;
    }
  }
  else {
    local_68[0].x = ctx.p.super_Tuple3<pbrt::Point3,_float>.x;
    local_68[0].y = ctx.p.super_Tuple3<pbrt::Point3,_float>.y;
    local_68[0].z = ctx.p.super_Tuple3<pbrt::Point3,_float>.z;
    local_68[1].x = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.x;
    local_68[1].y = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.y;
    local_68[1].z = ctx.dpdx.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_50[0].x = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.x;
    aTStack_50[0].y = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.y;
    aTStack_50[0].z = ctx.dpdy.super_Tuple3<pbrt::Vector3,_float>.z;
    aTStack_50[1].x = ctx.uv.super_Tuple2<pbrt::Point2,_float>.x;
    aTStack_50[1].y = ctx.uv.super_Tuple2<pbrt::Point2,_float>.y;
    aTStack_50[1].z = ctx.dudx;
    aTStack_50[2].x = ctx.dudy;
    aTStack_50[2].y = ctx.dvdx;
    aTStack_50[2].z = ctx.dvdy;
    iStack_2c = ctx.faceIndex;
    local_a8.bits =
         this->tex[1].
         super_TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
         .bits;
    FVar2 = detail::DispatchSplit<12>::operator()
                      (&local_a9,local_68,&local_a8,local_a8.bits >> 0x30);
    fVar3 = FVar2 * (float)local_98._0_4_;
  }
  return fVar3;
}

Assistant:

PBRT_CPU_GPU
    Float Evaluate(TextureEvalContext ctx) const {
        pstd::array<Float, 2> wt = Checkerboard(aaMethod, ctx, map2D, map3D);
        if (wt[0] == 0)
            return wt[1] * tex[1].Evaluate(ctx);
        else if (wt[1] == 0)
            return wt[0] * tex[0].Evaluate(ctx);
        else
            return wt[0] * tex[0].Evaluate(ctx) + wt[1] * tex[1].Evaluate(ctx);
    }